

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.h
# Opt level: O2

TransformPtr __thiscall Rml::Style::ComputedValues::transform(ComputedValues *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PropertyId in_SIL;
  TransformPtr TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  GetLocalProperty<std::shared_ptr<Rml::Transform>>(this,in_SIL,(shared_ptr<Rml::Transform> *)0x43);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (TransformPtr)TVar1.super___shared_ptr<Rml::Transform,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TransformPtr      transform()                  const { return GetLocalProperty(PropertyId::Transform, TransformPtr()); }